

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

void __thiscall
spvtools::opt::Instruction::ToBinaryWithoutAttachedDebugInsts
          (Instruction *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *binary)

{
  pointer pOVar1;
  const_iterator __position;
  uint **ppuVar2;
  uint *__first;
  uint32_t uVar3;
  const_iterator __last;
  uint **ppuVar4;
  Operand *operand;
  pointer pOVar5;
  uint local_2c;
  
  uVar3 = NumOperandWords(this);
  local_2c = uVar3 * 0x10000 + (uint)(ushort)(short)this->opcode_ + 0x10000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (binary,&local_2c);
  pOVar1 = (this->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pOVar5 = (this->operands_).
                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
                _M_impl.super__Vector_impl_data._M_start; pOVar5 != pOVar1; pOVar5 = pOVar5 + 1) {
    __position._M_current =
         (binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    ppuVar2 = (uint **)(pOVar5->words).large_data_._M_t.
                       super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                       ._M_head_impl;
    ppuVar4 = &(pOVar5->words).small_data_;
    if (ppuVar2 != (uint **)0x0) {
      ppuVar4 = ppuVar2;
    }
    __first = *ppuVar4;
    __last = utils::SmallVector<unsigned_int,_2UL>::end(&pOVar5->words);
    std::vector<unsigned_int,std::allocator<unsigned_int>>::insert<unsigned_int_const*,void>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)binary,__position,__first,__last
              );
  }
  return;
}

Assistant:

void Instruction::ToBinaryWithoutAttachedDebugInsts(
    std::vector<uint32_t>* binary) const {
  const uint32_t num_words = 1 + NumOperandWords();
  binary->push_back((num_words << 16) | static_cast<uint16_t>(opcode_));
  for (const auto& operand : operands_) {
    binary->insert(binary->end(), operand.words.begin(), operand.words.end());
  }
}